

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

size_t upb_Message_ExtensionCount(upb_Message *msg)

{
  long lVar1;
  long *plVar2;
  ulong uVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  
  if ((msg->field_0).internal_opaque < 2) {
    return 0;
  }
  uVar7 = 0;
  sVar5 = 0;
  do {
    puVar8 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
    if ((puVar8 == (uint *)0x0) || (uVar6 = uVar7, *puVar8 <= uVar7)) {
      bVar4 = false;
    }
    else {
      do {
        uVar6 = uVar6 + 1;
        bVar4 = false;
        if ((*(ulong *)(puVar8 + uVar6 * 2) & 1) != 0) {
          plVar2 = (long *)(*(ulong *)(puVar8 + uVar6 * 2) & 0xfffffffffffffffc);
          switch(*(byte *)(*plVar2 + 0xb) & 3) {
          case 0:
            lVar1 = plVar2[1];
            if (*(char *)(lVar1 + 3) == '\x01') {
              uVar3 = (ulong)*(uint *)(lVar1 + 0x10);
            }
            else {
              uVar3 = upb_inttable_count((upb_inttable *)(lVar1 + 8));
            }
            break;
          case 1:
            uVar3 = *(ulong *)(plVar2[1] + 8);
            break;
          case 2:
            goto switchD_0029a991_caseD_2;
          case 3:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/extension.h"
                          ,0x3f,
                          "_Bool _upb_Extension_IsEmpty_dont_copy_me__upb_internal_use_only(const upb_Extension *)"
                         );
          }
          if (uVar3 == 0) {
            bVar4 = false;
          }
          else {
switchD_0029a991_caseD_2:
            bVar4 = true;
            uVar7 = uVar6;
          }
        }
        if (bVar4) {
          bVar4 = true;
          goto LAB_0029a9ea;
        }
      } while (uVar6 < *puVar8);
      bVar4 = false;
      uVar7 = uVar6;
    }
LAB_0029a9ea:
    if (!bVar4) {
      return sVar5;
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

size_t upb_Message_ExtensionCount(const upb_Message* msg) {
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  if (!in) return 0;
  const upb_MiniTableExtension* ext;
  upb_MessageValue val;
  uintptr_t iter = kUpb_Message_ExtensionBegin;
  size_t count = 0;
  while (upb_Message_NextExtension(msg, &ext, &val, &iter)) {
    count++;
  }
  return count;
}